

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicPrimAttr<float>
          (AsciiParser *this,bool array_qual,string *primattr_name,Attribute *out_attr)

{
  ValueBlock VVar1;
  bool bVar2;
  bool bVar3;
  value_type_conflict2 *value_00;
  ostream *poVar4;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  byte bVar5;
  optional<float> value_1;
  PrimVar var;
  vector<float,_std::allocator<float>_> value;
  ostringstream ss_e_2;
  AttrMeta meta;
  Attribute attr;
  allocator local_701;
  Attribute *local_700;
  undefined1 local_6f8 [32];
  storage_union local_6d8;
  undefined **local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  undefined1 uStack_6b0;
  undefined7 uStack_6af;
  undefined1 uStack_6a8;
  undefined8 uStack_6a7;
  _Vector_base<float,_std::allocator<float>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658 [11];
  AttrMetas local_4e0;
  undefined1 local_2d8 [96];
  bool local_278;
  AttrMetas local_238;
  
  Attribute::Attribute((Attribute *)local_2d8);
  local_6c8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_6d8.dynamic = (void *)0x0;
  local_6c0 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  uStack_6af = 0;
  uStack_6a8 = 0;
  uStack_6a7 = 0;
  if ((int)CONCAT71(in_register_00000031,array_qual) == 0) {
    local_6f8[0] = (ValueBlock)0x0;
    local_6f8._4_4_ = (storage_t<float>)0x0;
    bVar2 = ReadBasicType(this,(optional<float> *)local_6f8);
    VVar1 = local_6f8[0];
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e0);
      poVar4 = ::std::operator<<((ostream *)&local_4e0,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseBasicPrimAttr");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xe2f);
      ::std::operator<<(poVar4," ");
      tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
      ::std::operator+(local_658,"Failed to parse ",&local_678);
      poVar4 = ::std::operator<<((ostream *)&local_4e0,(string *)local_658);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_658);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4e0);
      bVar2 = false;
      goto LAB_002d290a;
    }
    local_700 = out_attr;
    if (local_6f8[0] == (ValueBlock)0x1) {
      value_00 = nonstd::optional_lite::optional<float>::value((optional<float> *)local_6f8);
      linb::any::operator=((any *)&local_6d8,value_00);
    }
    bVar5 = (byte)VVar1 ^ 1;
  }
  else {
    bVar2 = MaybeNone(this);
    if (bVar2) {
      bVar5 = 0;
      local_700 = out_attr;
    }
    else {
      local_698._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_698._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_698._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_700 = out_attr;
      bVar3 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&local_698);
      if (bVar3) {
        linb::any::operator=((any *)&local_6d8,(vector<float,_std::allocator<float>_> *)&local_698);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e0);
        poVar4 = ::std::operator<<((ostream *)&local_4e0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseBasicPrimAttr");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xdf9);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_678,"Failed to parse Primtive Attribute {} type = {}[]",
                   &local_701);
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_658,(fmt *)&local_678,primattr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8,
                   in_R8);
        poVar4 = ::std::operator<<((ostream *)&local_4e0,(string *)local_658);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_658);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4e0);
      }
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_698);
      bVar2 = false;
      bVar5 = bVar2;
      if (!bVar3) goto LAB_002d290a;
    }
  }
  AttrMetas::AttrMetas(&local_4e0);
  bVar2 = ParseAttrMeta(this,&local_4e0);
  if (bVar2) {
    AttrMetas::operator=(&local_238,&local_4e0);
    if (bVar5 == 0) {
      Attribute::set_var((Attribute *)local_2d8,(PrimVar *)&local_6d8);
    }
    else {
      Attribute::set_value<tinyusdz::value::ValueBlock>
                ((Attribute *)local_2d8,(ValueBlock *)local_6f8);
      local_278 = true;
      if (array_qual) {
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        ::std::operator+(local_658,&local_678,"[]");
        ::std::__cxx11::string::_M_assign((string *)(local_2d8 + 0x28));
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        ::std::__cxx11::string::_M_assign((string *)(local_2d8 + 0x28));
      }
      ::std::__cxx11::string::_M_dispose();
    }
    Attribute::operator=(local_700,(Attribute *)local_2d8);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
    poVar4 = ::std::operator<<((ostream *)local_658,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseBasicPrimAttr");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xe43);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_658,"Failed to parse Attribute meta.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_678);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
  }
  AttrMetas::~AttrMetas(&local_4e0);
LAB_002d290a:
  primvar::PrimVar::~PrimVar((PrimVar *)&local_6d8);
  Attribute::~Attribute((Attribute *)local_2d8);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseBasicPrimAttr(bool array_qual,
                                     const std::string &primattr_name,
                                     Attribute *out_attr) {
  Attribute attr;
  primvar::PrimVar var;
  bool blocked{false};

  if (array_qual) {
    if (MaybeNone()) {
    } else {
      std::vector<T> value;
      if (!ParseBasicTypeArray(&value)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse Primtive Attribute {} type = {}[]", primattr_name,
                              std::string(value::TypeTraits<T>::type_name())));
      }

      // Empty array allowed.
      DCOUT("Got it: primatrr " << primattr_name << ", ty = " + std::string(value::TypeTraits<T>::type_name()) +
            ", sz = " + std::to_string(value.size()));
      var.set_value(value);
    }

#if 0
  // FIXME: Disable duplicated parsing attribute connection here, since parsing attribute connection will be handled in ParsePrimProps().
  } else if (hasConnect(primattr_name)) {
    std::string value;  // TODO: Use Path
    if (!ReadPathIdentifier(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse path identifier.");
    }

    // validate.
    Path connectionPath = pathutil::FromString(value);
    if (!connectionPath.is_valid()) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid connectionPath: {}.", value));
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    if (!pathutil::ResolveRelativePath(base_prim_path, connectionPath,
                                       &abs_path)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.", value));
    }

    // TODO: Use Path
    var.set_value(abs_path.full_path_name());

    // Check if attribute metadatum is not authored.
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      PUSH_ERROR_AND_RETURN(fmt::format("Attribute connection cannot have attribute metadataum: {}", primattr_name));
    }

#endif
  } else {
    nonstd::optional<T> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse " +
                            std::string(value::TypeTraits<T>::type_name()));
    }

    if (value) {
      DCOUT("ParseBasicPrimAttr: " << value::TypeTraits<T>::type_name() << " = "
                                   << (*value));

      var.set_value(value.value());

    } else {
      blocked = true;
      // std::cout << "ParseBasicPrimAttr: " <<
      // value::TypeTraits<T>::type_name()
      //           << " = None\n";
    }
  }

  // optional: attribute meta.
  AttrMeta meta;
  if (!ParseAttrMeta(&meta)) {
    PUSH_ERROR_AND_RETURN("Failed to parse Attribute meta.");
  }
  attr.metas() = meta;

  if (blocked) {
    // There is still have a type for ValueBlock.
    value::ValueBlock noneval;
    attr.set_value(noneval);
    attr.set_blocked(true);
    if (array_qual) {
      attr.set_type_name(value::TypeTraits<T>::type_name() + "[]");
    } else {
      attr.set_type_name(value::TypeTraits<T>::type_name());
    }
  } else {
    attr.set_var(std::move(var));
  }

  (*out_attr) = std::move(attr);

  return true;
}